

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

void rtcReleaseDevice(RTCDevice hdevice)

{
  undefined8 *puVar1;
  Lock<embree::MutexSys> lock;
  MutexSys *local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined1 local_30 [16];
  
  if (hdevice != (RTCDevice)0x0) {
    local_40 = &g_mutex;
    local_38 = 1;
    embree::MutexSys::lock(&g_mutex);
    (**(code **)(*(long *)hdevice + 0x18))(hdevice);
    embree::MutexSys::unlock(&g_mutex);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_40 = (MutexSys *)local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid argument","");
  *puVar1 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar1 + 1) = 2;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar1 + 2),local_40,
             (undefined1 *)((long)local_40 + CONCAT71(uStack_37,local_38)));
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcReleaseDevice(RTCDevice hdevice) 
  {
    Device* device = (Device*) hdevice;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcReleaseDevice);
    RTC_VERIFY_HANDLE(hdevice);
    Lock<MutexSys> lock(g_mutex);
    device->refDec();
    RTC_CATCH_END(nullptr);
  }